

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_wrapper.h
# Opt level: O0

void __thiscall leveldb::IteratorWrapper::Prev(IteratorWrapper *this)

{
  long lVar1;
  IteratorWrapper *in_RDI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI->iter_ == (Iterator *)0x0) {
    __assert_fail("iter_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/table/iterator_wrapper.h"
                  ,0x39,"void leveldb::IteratorWrapper::Prev()");
  }
  (*in_RDI->iter_->_vptr_Iterator[7])();
  Update(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Prev() {
    assert(iter_);
    iter_->Prev();
    Update();
  }